

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AttributeRelativeOffsetCase::test
          (AttributeRelativeOffsetCase *this,ResultCollector *result)

{
  deUint32 *this_00;
  int iVar1;
  deUint32 dVar2;
  deBool dVar3;
  int iVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  Enum<int,_2UL> EVar7;
  GetNameFunc local_660;
  int local_658;
  string local_650;
  allocator<char> local_629;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  GLenum local_5a8;
  GLuint local_5a4;
  deUint32 err_5;
  int offset;
  int va;
  int randomTestNdx;
  int numRandomTests;
  Random rnd;
  allocator<char> local_559;
  string local_558;
  ScopedLogSection local_538;
  ScopedLogSection section_2;
  TestLog *local_520;
  int local_518;
  string local_510;
  allocator<char> local_4e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  GLenum local_464;
  GetNameFunc p_Stack_460;
  deUint32 err_4;
  int local_458;
  GetNameFunc local_450;
  int local_448;
  string local_440;
  allocator<char> local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  GLenum local_394;
  GetNameFunc p_Stack_390;
  deUint32 err_3;
  int local_388;
  GetNameFunc local_380;
  int local_378;
  string local_370;
  allocator<char> local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  GLenum local_2c4;
  GetNameFunc p_Stack_2c0;
  deUint32 err_2;
  int local_2b8;
  GetNameFunc local_2b0;
  int local_2a8;
  string local_2a0;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  GLenum local_1f4;
  undefined1 local_1f0 [4];
  deUint32 err_1;
  VertexArray otherVao;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  ScopedLogSection local_188;
  ScopedLogSection section_1;
  int attr;
  allocator<char> local_151;
  string local_150;
  ScopedLogSection local_130;
  ScopedLogSection section;
  TestLog *local_118;
  int local_110;
  string local_108;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  GLenum local_5c;
  GLint local_58;
  deUint32 err;
  GLint maxAttrs;
  undefined1 local_48 [8];
  VertexArray vao;
  CallLogWrapper gl;
  ResultCollector *result_local;
  AttributeRelativeOffsetCase *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_AttributeCase).super_TestCase.m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar6);
  pRVar5 = gles31::Context::getRenderContext((this->super_AttributeCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48,pRVar5);
  local_58 = -1;
  this_00 = &vao.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)this_00,dVar2);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x8869,&local_58);
  do {
    local_5c = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
    if (local_5c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Got Error ",&local_e1)
      ;
      EVar7 = glu::getErrorStr(local_5c);
      section.m_log = (TestLog *)EVar7.m_getName;
      local_110 = EVar7.m_value;
      local_118 = section.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_108,&local_118);
      std::operator+(&local_c0,&local_e0,&local_108);
      std::operator+(&local_a0,&local_c0,": ");
      std::operator+(&local_80,&local_a0,"glGetIntegerv");
      tcu::ResultCollector::fail(result,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"initial",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attr,"Initial values",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_130,pTVar6,&local_150,(string *)&attr);
  std::__cxx11::string::~string((string *)&attr);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  section_1.m_log._0_4_ = 0;
  while( true ) {
    iVar1 = (int)section_1.m_log;
    iVar4 = de::max<int>(0x10,local_58);
    if (iVar4 <= iVar1) break;
    deqp::gls::StateQueryUtil::verifyStateAttributeInteger
              (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82d5,
               (int)section_1.m_log,0,(this->super_AttributeCase).m_verifier);
    section_1.m_log._0_4_ = (int)section_1.m_log + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_130);
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"vao",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"VAO state",
             (allocator<char> *)&otherVao.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_188,pTVar6,&local_1a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&otherVao.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pRVar5 = gles31::Context::getRenderContext((this->super_AttributeCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_1f0,pRVar5);
  glu::CallLogWrapper::glVertexAttribFormat
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,4,0x1406,'\0',9);
  do {
    local_1f4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_1f4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"Got Error ",&local_279);
      EVar7 = glu::getErrorStr(local_1f4);
      p_Stack_2c0 = EVar7.m_getName;
      local_2b8 = EVar7.m_value;
      local_2b0 = p_Stack_2c0;
      local_2a8 = local_2b8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2a0,&local_2b0);
      std::operator+(&local_258,&local_278,&local_2a0);
      std::operator+(&local_238,&local_258,": ");
      std::operator+(&local_218,&local_238,"glVertexAttribFormat");
      tcu::ResultCollector::fail(result,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_1f0);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  do {
    local_2c4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_2c4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"Got Error ",&local_349);
      EVar7 = glu::getErrorStr(local_2c4);
      p_Stack_390 = EVar7.m_getName;
      local_388 = EVar7.m_value;
      local_380 = p_Stack_390;
      local_378 = local_388;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_370,&local_380);
      std::operator+(&local_328,&local_348,&local_370);
      std::operator+(&local_308,&local_328,": ");
      std::operator+(&local_2e8,&local_308,"glBindVertexArray");
      tcu::ResultCollector::fail(result,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  glu::CallLogWrapper::glVertexAttribFormat
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,4,0x1406,'\0',0x15);
  do {
    local_394 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_394 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,"Got Error ",&local_419);
      EVar7 = glu::getErrorStr(local_394);
      p_Stack_460 = EVar7.m_getName;
      local_458 = EVar7.m_value;
      local_450 = p_Stack_460;
      local_448 = local_458;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_440,&local_450);
      std::operator+(&local_3f8,&local_418,&local_440);
      std::operator+(&local_3d8,&local_3f8,": ");
      std::operator+(&local_3b8,&local_3d8,"glVertexAttribFormat");
      tcu::ResultCollector::fail(result,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  do {
    local_464 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_464 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"Got Error ",&local_4e9);
      EVar7 = glu::getErrorStr(local_464);
      section_2.m_log = (TestLog *)EVar7.m_getName;
      local_518 = EVar7.m_value;
      local_520 = section_2.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_510,&local_520);
      std::operator+(&local_4c8,&local_4e8,&local_510);
      std::operator+(&local_4a8,&local_4c8,": ");
      std::operator+(&local_488,&local_4a8,"glBindVertexArray");
      tcu::ResultCollector::fail(result,&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  deqp::gls::StateQueryUtil::verifyStateAttributeInteger
            (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82d5,1,9,
             (this->super_AttributeCase).m_verifier);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_1f0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_188);
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"random",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rnd.m_rnd.w,"Random values",(allocator<char> *)((long)&rnd.m_rnd.z + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_538,pTVar6,&local_558,(string *)&rnd.m_rnd.w);
  std::__cxx11::string::~string((string *)&rnd.m_rnd.w);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rnd.m_rnd.z + 3));
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  de::Random::Random((Random *)&randomTestNdx,0xabc);
  va = 10;
  for (offset = 0; offset < 10; offset = offset + 1) {
    iVar1 = de::max<int>(0x10,local_58);
    err_5 = de::Random::getInt((Random *)&randomTestNdx,0,iVar1 + -1);
    local_5a4 = de::Random::getInt((Random *)&randomTestNdx,0,0x7ff);
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,err_5,4,0x1406,'\0',local_5a4);
    do {
      local_5a8 = glu::CallLogWrapper::glGetError
                            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
      if (local_5a8 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_628,"Got Error ",&local_629);
        EVar7 = glu::getErrorStr(local_5a8);
        local_660 = EVar7.m_getName;
        local_658 = EVar7.m_value;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_650,&local_660);
        std::operator+(&local_608,&local_628,&local_650);
        std::operator+(&local_5e8,&local_608,": ");
        std::operator+(&local_5c8,&local_5e8,"glVertexAttribFormat");
        tcu::ResultCollector::fail(result,&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_650);
        std::__cxx11::string::~string((string *)&local_628);
        std::allocator<char>::~allocator(&local_629);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    deqp::gls::StateQueryUtil::verifyStateAttributeInteger
              (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82d5,err_5,local_5a4,
               (this->super_AttributeCase).m_verifier);
  }
  de::Random::~Random((Random *)&randomTestNdx);
  tcu::ScopedLogSection::~ScopedLogSection(&local_538);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void AttributeRelativeOffsetCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao			(m_context.getRenderContext());
	glw::GLint			maxAttrs	= -1;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxAttrs);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int attr = 0; attr < de::max(16, maxAttrs); ++attr)
			verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, attr, 0, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glVertexAttribFormat(1, 4, GL_FLOAT, GL_FALSE, 9);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		gl.glVertexAttribFormat(1, 4, GL_FLOAT, GL_FALSE, 21);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, 1, 9, m_verifier);
	}

	// random values
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0xabc);
		const int					numRandomTests	= 10;

		for (int randomTestNdx = 0; randomTestNdx < numRandomTests; ++randomTestNdx)
		{
			const int	va				= rnd.getInt(0, de::max(16, maxAttrs)-1);
			const int	offset			= rnd.getInt(0, 2047);

			gl.glVertexAttribFormat(va, 4, GL_FLOAT, GL_FALSE, offset);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

			verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, va, offset, m_verifier);
		}
	}
}